

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::read_real_array(Simulator *this,PCode *code)

{
  double dVar1;
  int iVar2;
  Symbol *this_00;
  vector<double,_std::allocator<double>_> array;
  double input;
  _Vector_base<double,_std::allocator<double>_> local_40;
  double local_28;
  
  local_28 = 0.0;
  this_00 = ScopeTree::resolve(&this->tree_,&code->first_);
  std::istream::_M_extract<double>((double *)&std::cin);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_40,&(this_00->value_).real_array);
  dVar1 = local_28;
  iVar2 = get_second_parameter(this,&code->second_);
  local_40._M_impl.super__Vector_impl_data._M_start[iVar2] = dVar1;
  Symbol::set_value(this_00,(vector<double,_std::allocator<double>_> *)&local_40);
  this_00->is_assigned_ = true;
  this->eip_ = this->eip_ + 1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void Simulator::read_real_array(const PCode &code) {
    double input = 0;
    Symbol &symbol = tree_.resolve(code.first());

    std::cin >> input;
    std::vector<double> array = symbol.real_array();
    array[get_second_parameter(code.second())] = input;
    symbol.set_value(array);
    symbol.set_assigned();

    inc_eip();
}